

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::SerializeWithCachedSizes
          (UniDirectionalLSTMLayerParams *this,CodedOutputStream *output)

{
  int iVar1;
  Type *value;
  int index;
  
  if (this->inputvectorsize_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,this->inputvectorsize_,output);
  }
  if (this->outputvectorsize_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,this->outputvectorsize_,output);
  }
  iVar1 = (this->activations_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    index = 0;
    do {
      value = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                        (&(this->activations_).super_RepeatedPtrFieldBase,index);
      google::protobuf::internal::WireFormatLite::WriteMessage(10,&value->super_MessageLite,output);
      index = index + 1;
    } while (iVar1 != index);
  }
  if (this != (UniDirectionalLSTMLayerParams *)&_UniDirectionalLSTMLayerParams_default_instance_ &&
      this->params_ != (LSTMParams *)0x0) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0xf,&this->params_->super_MessageLite,output);
  }
  if (this->weightparams_ != (LSTMWeightParams *)0x0 &&
      this != (UniDirectionalLSTMLayerParams *)&_UniDirectionalLSTMLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x14,&this->weightparams_->super_MessageLite,output);
  }
  if (this->reverseinput_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(100,true,output);
    return;
  }
  return;
}

Assistant:

void UniDirectionalLSTMLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.UniDirectionalLSTMLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 inputVectorSize = 1;
  if (this->inputvectorsize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->inputvectorsize(), output);
  }

  // uint64 outputVectorSize = 2;
  if (this->outputvectorsize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->outputvectorsize(), output);
  }

  // repeated .CoreML.Specification.ActivationParams activations = 10;
  for (unsigned int i = 0, n = this->activations_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      10, this->activations(i), output);
  }

  // .CoreML.Specification.LSTMParams params = 15;
  if (this->has_params()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      15, *this->params_, output);
  }

  // .CoreML.Specification.LSTMWeightParams weightParams = 20;
  if (this->has_weightparams()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      20, *this->weightparams_, output);
  }

  // bool reverseInput = 100;
  if (this->reverseinput() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(100, this->reverseinput(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.UniDirectionalLSTMLayerParams)
}